

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshift.c
# Opt level: O0

void * mpt_qshift(mpt_queue *queue,size_t len,void *data)

{
  size_t sVar1;
  int *piVar2;
  void *local_38;
  uint8_t *addr;
  size_t low;
  void *data_local;
  size_t len_local;
  mpt_queue *queue_local;
  
  low = (size_t)data;
  data_local = (void *)len;
  len_local = (size_t)queue;
  local_38 = mpt_queue_data(queue,(size_t *)&addr);
  sVar1 = low;
  if (addr < data_local) {
    if (low == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return (void *)0x0;
    }
    if (*(void **)(len_local + 8) < data_local) {
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      return (void *)0x0;
    }
    memcpy((void *)low,local_38,(size_t)addr);
    local_38 = (void *)sVar1;
    memcpy(addr + sVar1,*(void **)len_local,(long)data_local - (long)addr);
  }
  else if (low != 0) {
    memcpy((void *)low,local_38,(size_t)data_local);
  }
  mpt_queue_crop((mpt_queue *)len_local,0,(size_t)data_local);
  return local_38;
}

Assistant:

extern void *mpt_qshift(MPT_STRUCT(queue) *queue, size_t len, void *data)
{
	size_t low;
	uint8_t *addr;
	
	addr = mpt_queue_data(queue, &low);
	
	if (len <= low) {
		if (data) {
			(void) memcpy(data, addr, len);
		}
	}
	/* need data from both segments */
	else {
		if (!data) {
			errno = EINVAL;
			return 0;
		}
		if (len > queue->len) {
			errno = ERANGE;
			return 0;
		}
		addr = memcpy(data, addr, low);
		(void) memcpy(addr+low, queue->base, len-low);
	}
	/* remove data area from queue start */
	mpt_queue_crop(queue, 0, len);
	
	return addr;
}